

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_TakeStepMRISR(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  N_Vector in_RCX;
  N_Vector p_Var6;
  char *msgfmt;
  undefined4 uVar7;
  int stage;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  sunrealtype sVar11;
  int nvec;
  double local_68;
  int local_5c;
  N_Vector local_58;
  int *local_50;
  sunrealtype *local_48;
  long local_40;
  ARKodeMRIStepMem step_mem;
  
  iVar3 = mriStep_AccessStepMem(ark_mem,"mriStep_TakeStepMRISR",&step_mem);
  if (iVar3 != 0) {
    return iVar3;
  }
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  p_Var6 = ark_mem->tempv4;
  local_50 = nflagPtr;
  local_5c = SUNAdaptController_GetType(ark_mem->hadapt_mem->hcontroller);
  if (local_5c == 2) {
    step_mem->inner_dsm = 0.0;
    iVar3 = mriStepInnerStepper_ResetAccumulatedError(step_mem->stepper);
    if (iVar3 != 0) {
      msgfmt = "Unable to reset the inner stepper error estimate";
      iVar3 = 0x912;
      goto LAB_001523b7;
    }
    iVar3 = mriStepInnerStepper_SetRTol
                      (step_mem->stepper,step_mem->inner_rtol_factor * ark_mem->reltol);
    if (iVar3 != 0) {
      msgfmt = "Unable to set the inner stepper tolerance";
      iVar3 = 0x91b;
      goto LAB_001523b7;
    }
  }
  if ((ark_mem->fixedstep == 0) &&
     (iVar3 = mriStepInnerStepper_Reset(step_mem->stepper,ark_mem->tn,ark_mem->yn), iVar3 != 0)) {
    msgfmt = "Unable to reset the inner stepper";
    iVar3 = 0x928;
    goto LAB_001523b7;
  }
  local_58 = p_Var6;
  if (step_mem->expforcing == 0) {
    bVar5 = step_mem->impforcing != 0;
    p_Var6 = ark_mem->fn;
    if (p_Var6 == (N_Vector)0x0 || bVar5) goto LAB_001523eb;
LAB_00152473:
    if (ark_mem->fn_is_current == 0) {
      in_RCX = (N_Vector)0x0;
      iVar3 = mriStep_FullRHS(ark_mem,ark_mem->tn,ark_mem->yn,p_Var6,0);
      if (iVar3 != 0) {
        return -8;
      }
    }
  }
  else {
    bVar5 = true;
LAB_001523eb:
    in_RCX = (N_Vector)0x0;
    iVar3 = mriStep_UpdateF0(ark_mem,step_mem,ark_mem->tn,ark_mem->yn,0);
    if (iVar3 != 0) {
      return -8;
    }
    p_Var6 = ark_mem->fn;
    if ((bool)(p_Var6 != (N_Vector)0x0 & bVar5)) {
      if (step_mem->implicit_rhs != 0) {
        if (step_mem->explicit_rhs == 0) {
          N_VScale(0x3ff0000000000000,*step_mem->Fsi,p_Var6);
        }
        else {
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fsi,*step_mem->Fse);
        }
      }
      p_Var6 = ark_mem->fn;
    }
    if (p_Var6 != (N_Vector)0x0) goto LAB_00152473;
  }
  ark_mem->fn_is_current = 1;
  if ((step_mem->implicit_rhs != 0) && (step_mem->explicit_rhs != 0)) {
    in_RCX = (N_Vector)step_mem->Fsi;
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fse,(N_Vector)in_RCX->content,
                 *step_mem->Fse);
  }
  if ((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
    iVar3 = step_mem->stages + 1;
  }
  else {
    iVar3 = step_mem->stages;
  }
  local_40 = (long)iVar3;
  uVar8 = 1;
  local_48 = dsmPtr;
  while( true ) {
    p_Var6 = local_58;
    if (local_40 <= (long)uVar8) {
      if ((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,local_58,ark_mem->ycur,ark_mem->tempv1);
        sVar11 = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
        *local_48 = sVar11;
        N_VScale(0x3ff0000000000000,p_Var6,ark_mem->ycur);
      }
      return 0;
    }
    uVar1 = step_mem->stages;
    uVar9 = (ulong)uVar1;
    N_VScale(0x3ff0000000000000,ark_mem->yn,ark_mem->ycur);
    local_68 = 1.0;
    if (uVar8 != uVar9) {
      local_68 = step_mem->MRIC->c[uVar8];
    }
    stage = (int)uVar8;
    iVar3 = mriStep_ComputeInnerForcing
                      (ark_mem,step_mem,stage,ark_mem->tn,ark_mem->h * local_68 + ark_mem->tn);
    if (iVar3 != 0) {
      return iVar3;
    }
    if ((1 < uVar8) &&
       (iVar3 = mriStepInnerStepper_Reset(step_mem->stepper,ark_mem->tn,ark_mem->ycur), iVar3 != 0))
    break;
    bVar5 = local_5c == 2 && uVar8 != uVar9;
    in_RCX = (N_Vector)CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
    iVar3 = mriStep_StageERKFast
                      (ark_mem,step_mem,ark_mem->tn,ark_mem->h * local_68 + ark_mem->tn,
                       ark_mem->ycur,in_RCX,(uint)bVar5);
    if (iVar3 != 0) {
      *local_50 = 4;
      return iVar3;
    }
    ark_mem->tcur = local_68 * ark_mem->h + ark_mem->tn;
    if (step_mem->implicit_rhs == 0) {
LAB_001527d0:
      uVar7 = 0;
    }
    else {
      if (ABS((*step_mem->MRIC->G)[uVar8][uVar8]) <= 2.220446049250313e-14) {
        *step_mem->cvals = 1.0;
        *step_mem->Xvecs = ark_mem->ycur;
        for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
          step_mem->cvals[uVar4 + 1] = ark_mem->h * (*step_mem->MRIC->G)[uVar8][uVar4];
          step_mem->Xvecs[uVar4 + 1] = step_mem->Fsi[uVar4];
        }
        in_RCX = ark_mem->ycur;
        iVar3 = N_VLinearCombination(stage + 1,step_mem->cvals,step_mem->Xvecs,in_RCX);
        if (iVar3 != 0) {
          return -0x1c;
        }
        goto LAB_001527d0;
      }
      iVar3 = stage - (uint)(uVar8 == (uint)step_mem->stages);
      step_mem->istage = iVar3;
      iVar3 = mriStep_Predict(ark_mem,iVar3,step_mem->zpred);
      if (iVar3 != 0) {
        return iVar3;
      }
      if (step_mem->stage_predict != (ARKStagePredictFn)0x0) {
        iVar3 = (*step_mem->stage_predict)(ark_mem->tcur,step_mem->zpred,ark_mem->user_data);
        if (iVar3 < 0) {
          return -0x27;
        }
        if (iVar3 != 0) {
          return 5;
        }
      }
      *step_mem->cvals = 1.0;
      *step_mem->Xvecs = ark_mem->ycur;
      step_mem->cvals[1] = -1.0;
      step_mem->Xvecs[1] = step_mem->zpred;
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        step_mem->cvals[uVar4 + 2] = ark_mem->h * (*step_mem->MRIC->G)[uVar8][uVar4];
        step_mem->Xvecs[uVar4 + 2] = step_mem->Fsi[uVar4];
      }
      in_RCX = step_mem->sdata;
      iVar3 = N_VLinearCombination(stage + 2,step_mem->cvals,step_mem->Xvecs,in_RCX);
      piVar2 = local_50;
      if (iVar3 != 0) {
        return -0x1c;
      }
      dVar10 = ark_mem->h * (*step_mem->MRIC->G)[uVar8][uVar8];
      step_mem->gamma = dVar10;
      if (ark_mem->firststage == 0) {
        dVar10 = dVar10 / step_mem->gammap;
      }
      else {
        step_mem->gammap = dVar10;
        dVar10 = 1.0;
      }
      step_mem->gamrat = dVar10;
      iVar3 = mriStep_Nls(ark_mem,*local_50);
      *piVar2 = iVar3;
      uVar7 = (undefined4)CONCAT71((int7)((ulong)piVar2 >> 8),1);
      if (iVar3 != 0) {
        return 5;
      }
    }
    if (ark_mem->ProcessStage != (ARKPostProcessFn)0x0) {
      iVar3 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data);
      if (iVar3 != 0) {
        return -0x26;
      }
      iVar3 = mriStepInnerStepper_Reset(step_mem->stepper,ark_mem->tcur,ark_mem->ycur);
      if (iVar3 != 0) {
        msgfmt = "Unable to reset the inner stepper";
        iVar3 = 0xa28;
        goto LAB_001523b7;
      }
    }
    local_68 = (double)CONCAT44(local_68._4_4_,uVar7);
    uVar4 = (ulong)(uVar1 - 1);
    in_RCX = (N_Vector)((ulong)in_RCX & 0xffffffffffffff00);
    if (uVar8 != uVar4 && uVar8 != uVar9) {
      if (step_mem->explicit_rhs != 0) {
        iVar3 = (*step_mem->fse)(ark_mem->tcur,ark_mem->ycur,step_mem->Fse[uVar8],ark_mem->user_data
                                );
        step_mem->nfse = step_mem->nfse + 1;
        if (iVar3 < 0) {
          return -8;
        }
        if (iVar3 != 0) {
          return -0xb;
        }
        if (step_mem->expforcing != 0) {
          *step_mem->cvals = 1.0;
          *step_mem->Xvecs = step_mem->Fse[uVar8];
          nvec = 1;
          mriStep_ApplyForcing(step_mem,ark_mem->tcur,1.0,&nvec);
          in_RCX = step_mem->Fse[uVar8];
          N_VLinearCombination(nvec,step_mem->cvals,step_mem->Xvecs,in_RCX);
        }
      }
      if (step_mem->implicit_rhs != 0) {
        if ((local_68._0_1_ & step_mem->deduce_rhs != 0) == 0) {
          iVar3 = (*step_mem->fsi)(ark_mem->tcur,ark_mem->ycur,step_mem->Fsi[uVar8],
                                   ark_mem->user_data);
          step_mem->nfsi = step_mem->nfsi + 1;
          if (iVar3 < 0) {
            return -8;
          }
          if (iVar3 != 0) {
            return -0xb;
          }
          if (step_mem->impforcing != 0) {
            *step_mem->cvals = 1.0;
            *step_mem->Xvecs = step_mem->Fsi[uVar8];
            nvec = 1;
            mriStep_ApplyForcing(step_mem,ark_mem->tcur,1.0,&nvec);
            in_RCX = step_mem->Fsi[uVar8];
            N_VLinearCombination(nvec,step_mem->cvals,step_mem->Xvecs,in_RCX);
          }
        }
        else {
          N_VLinearSum(1.0 / step_mem->gamma,-1.0 / step_mem->gamma,step_mem->zcor,step_mem->sdata,
                       step_mem->Fsi[uVar8]);
        }
        if ((step_mem->implicit_rhs != 0) && (step_mem->explicit_rhs != 0)) {
          in_RCX = (N_Vector)step_mem->Fsi;
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,step_mem->Fse[uVar8],
                       (N_Vector)(&in_RCX->content)[uVar8],step_mem->Fse[uVar8]);
        }
      }
    }
    if (uVar8 == uVar4) {
      N_VScale(0x3ff0000000000000,ark_mem->ycur,local_58);
    }
    uVar8 = uVar8 + 1;
  }
  msgfmt = "Unable to reset the inner stepper";
  iVar3 = 0x999;
LAB_001523b7:
  arkProcessError(ark_mem,-0x22,iVar3,"mriStep_TakeStepMRISR",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return -0x22;
}

Assistant:

int mriStep_TakeStepMRISR(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeMRIStepMem step_mem;          /* outer stepper memory       */
  int stage, j;                       /* stage indices              */
  int retval;                         /* reusable return flag       */
  N_Vector ytilde;                    /* embedded solution          */
  N_Vector ytemp;                     /* temporary vector           */
  SUNAdaptController_Type adapt_type; /* timestep adaptivity type   */
  sunbooleantype embedding;           /* flag indicating embedding  */
  sunbooleantype solution;            /*   or solution stages       */
  sunbooleantype impl_corr;           /* is slow correct. implicit? */
  sunrealtype cstage;                 /* current stage abscissa     */
  sunbooleantype need_inner_dsm;
  sunbooleantype nested_mri;
  int nvec, max_stages;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access the MRIStep mem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* initialize algebraic solver convergence flag to success;
     error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* set N_Vector shortcuts */
  ytilde = ark_mem->tempv4;
  ytemp  = ark_mem->tempv2;

  /* if MRI adaptivity is enabled: reset fast accumulated error,
     and send appropriate control parameter to the fast integrator */
  adapt_type     = SUNAdaptController_GetType(ark_mem->hadapt_mem->hcontroller);
  need_inner_dsm = SUNFALSE;
  if (adapt_type == SUN_ADAPTCONTROLLER_MRI_H_TOL)
  {
    need_inner_dsm      = SUNTRUE;
    step_mem->inner_dsm = ZERO;
    retval = mriStepInnerStepper_ResetAccumulatedError(step_mem->stepper);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper error estimate");
      return (ARK_INNERSTEP_FAIL);
    }
    retval = mriStepInnerStepper_SetRTol(step_mem->stepper,
                                         step_mem->inner_rtol_factor *
                                           ark_mem->reltol);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to set the inner stepper tolerance");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  /* for adaptive computations, reset the inner integrator to the beginning of this step */
  if (!ark_mem->fixedstep)
  {
    retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                       ark_mem->yn);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  SUNLogInfo(ARK_LOGGER, "begin-stage",
             "stage = 0, stage type = %d, tcur = " SUN_FORMAT_G, MRISTAGE_FIRST,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur, "z_0(:) =");

  /* Evaluate the slow RHS functions if needed. NOTE: we decide between calling the
     full RHS function (if ark_mem->fn is non-NULL and MRIStep is not an inner
     integrator) versus just updating the stored values of Fse[0] and Fsi[0].  In
     either case, we use ARK_FULLRHS_START mode because MRISR methods do not
     evaluate the RHS functions at the end of the time step (so nothing can be
     leveraged). */
  nested_mri = step_mem->expforcing || step_mem->impforcing;
  if (ark_mem->fn == NULL || nested_mri)
  {
    retval = mriStep_UpdateF0(ark_mem, step_mem, ark_mem->tn, ark_mem->yn,
                              ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed update F0 eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* For a nested MRI configuration we might still need fn to create a predictor
       but it should be fn only for the current nesting level which is why we use
       UpdateF0 in this case rather than FullRHS */
    if (ark_mem->fn != NULL && nested_mri && step_mem->implicit_rhs)
    {
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, step_mem->Fse[0], ark_mem->fn);
      }
      else { N_VScale(ONE, step_mem->Fsi[0], ark_mem->fn); }
    }
  }
  if (ark_mem->fn != NULL && !ark_mem->fn_is_current)
  {
    retval = mriStep_FullRHS(ark_mem, ark_mem->tn, ark_mem->yn, ark_mem->fn,
                             ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed full rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }
  }
  ark_mem->fn_is_current = SUNTRUE;

  SUNLogExtraDebugVecIf(step_mem->explicit_rhs, ARK_LOGGER, "slow explicit RHS",
                        step_mem->Fse[0], "Fse_0(:) =");
  SUNLogExtraDebugVecIf(step_mem->implicit_rhs, ARK_LOGGER, "slow implicit RHS",
                        step_mem->Fsi[0], "Fsi_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  /* combine both RHS into FSE for ImEx problems, since MRISR fast forcing function
     only depends on Omega coefficients  */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    N_VLinearSum(ONE, step_mem->Fse[0], ONE, step_mem->Fsi[0], step_mem->Fse[0]);
  }

  /* The first stage is the previous time-step solution, so its RHS
     is the [already-computed] slow RHS from the start of the step */

  /* Determine how many stages will be needed */
  max_stages = (ark_mem->fixedstep &&
                (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE))
                 ? step_mem->stages
                 : step_mem->stages + 1;

  /* Loop over stages */
  for (stage = 1; stage < max_stages; stage++)
  {
    /* Determine if this is an "embedding" or "solution" stage */
    solution  = (stage == step_mem->stages - 1);
    embedding = (stage == step_mem->stages);

    /* Set initial condition for this stage */
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);

    /* Set current stage abscissa */
    cstage = (embedding) ? ONE : step_mem->MRIC->c[stage];

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, stage type = %d, tcur = " SUN_FORMAT_G, stage,
               MRISTAGE_ERK_FAST, ark_mem->tn + cstage * ark_mem->h);

    /* Compute forcing function for inner solver */
    retval = mriStep_ComputeInnerForcing(ark_mem, step_mem, stage, ark_mem->tn,
                                         ark_mem->tn + cstage * ark_mem->h);
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed forcing computation, retval = %i", retval);
      return retval;
    }

    /* Reset the inner stepper on all but the first stage due to
       "stage-restart" structure */
    if (stage > 1)
    {
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Evolve fast IVP for this stage, potentially get inner dsm on
       all non-embedding stages */
    retval = mriStep_StageERKFast(ark_mem, step_mem, ark_mem->tn,
                                  ark_mem->tn + cstage * ark_mem->h,
                                  ark_mem->ycur, ytemp,
                                  need_inner_dsm && !embedding);
    if (retval != ARK_SUCCESS)
    {
      *nflagPtr = CONV_FAIL;
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed fast ERK stage, retval = %i", retval);
      return retval;
    }

    /* set current stage time for implicit correction, postprocessing
       and RHS calls */
    ark_mem->tcur = ark_mem->tn + cstage * ark_mem->h;

    /* perform MRISR slow/implicit correction */
    impl_corr = SUNFALSE;
    if (step_mem->implicit_rhs)
    {
      /* determine whether implicit RHS correction will require an implicit solve */
      impl_corr = SUNRabs(step_mem->MRIC->G[0][stage][stage]) > tol;

      /* perform implicit solve for correction */
      if (impl_corr)
      {
        /* store current stage index (for an "embedded" stage, subtract 1) */
        step_mem->istage = (stage == step_mem->stages) ? stage - 1 : stage;

        /* Call predictor for current stage solution (result placed in zpred) */
        retval = mriStep_Predict(ark_mem, step_mem->istage, step_mem->zpred);
        if (retval != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed predict, retval = %i", retval);
          return (retval);
        }

        /* If a user-supplied predictor routine is provided, call that here
           Note that mriStep_Predict is *still* called, so this user-supplied
           routine can just "clean up" the built-in prediction, if desired. */
        if (step_mem->stage_predict)
        {
          retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                           ark_mem->user_data);

          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed predict, retval = %i", retval);
          if (retval < 0) { return (ARK_USER_PREDICT_FAIL); }
          if (retval > 0) { return (TRY_AGAIN); }
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "predictor", step_mem->zpred,
                            "zpred(:) =");

        /* fill sdata with explicit contributions to correction */
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        step_mem->cvals[1] = -ONE;
        step_mem->Xvecs[1] = step_mem->zpred;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 2] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 2] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 2, step_mem->cvals,
                                      step_mem->Xvecs, step_mem->sdata);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "rhs data", step_mem->sdata,
                            "sdata(:) =");

        /* Update gamma for implicit solver */
        step_mem->gamma = ark_mem->h * step_mem->MRIC->G[0][stage][stage];
        if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
        step_mem->gamrat =
          (ark_mem->firststage) ? ONE : step_mem->gamma / step_mem->gammap;

        /* perform implicit solve (result is stored in ark_mem->ycur); return
           with positive value on anything but success */
        *nflagPtr = mriStep_Nls(ark_mem, *nflagPtr);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
      /* perform explicit update for correction */
      else
      {
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 1] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 1] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 1, step_mem->cvals,
                                      step_mem->Xvecs, ark_mem->ycur);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }
      }
    }

    SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur,
                        "z_%i(:) =", stage);

    /* apply user-supplied stage postprocessing function (if supplied),
       and reset the inner integrator with the modified stage solution */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tcur,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Compute updated slow RHS (except for final solution or embedding) */
    if ((!solution) && (!embedding))
    {
      /* store explicit slow rhs */
      if (step_mem->explicit_rhs)
      {
        retval = step_mem->fse(ark_mem->tcur, ark_mem->ycur,
                               step_mem->Fse[stage], ark_mem->user_data);
        step_mem->nfse++;

        SUNLogExtraDebugVec(ARK_LOGGER, "slow explicit RHS",
                            step_mem->Fse[stage], "Fse_%i(:) =", stage);
        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed explicit rhs eval, retval = %i", retval);

        if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
        if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

        /* Add external forcing to Fse[stage], if applicable */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[stage];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[stage]);
        }
      }

      /* store implicit slow rhs */
      if (step_mem->implicit_rhs)
      {
        if (!step_mem->deduce_rhs || !impl_corr)
        {
          retval = step_mem->fsi(ark_mem->tcur, ark_mem->ycur,
                                 step_mem->Fsi[stage], ark_mem->user_data);
          step_mem->nfsi++;

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed implicit rhs eval, retval = %i", retval);

          if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
          if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

          /* Add external forcing to Fsi[stage], if applicable */
          if (step_mem->impforcing)
          {
            step_mem->cvals[0] = ONE;
            step_mem->Xvecs[0] = step_mem->Fsi[stage];
            nvec               = 1;
            mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
            N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                                 step_mem->Fsi[stage]);
          }
        }
        else
        {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata,
                       step_mem->Fsi[stage]);

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
        }
      }

      /* combine both RHS into Fse for ImEx problems since
         fast forcing function only depends on Omega coefficients */
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fse[stage], ONE, step_mem->Fsi[stage],
                     step_mem->Fse[stage]);
      }
    }

    /* If this is the solution stage, archive for error estimation */
    if (solution) { N_VScale(ONE, ark_mem->ycur, ytilde); }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  } /* loop over stages */

  /* if temporal error estimation is enabled: compute estimate via difference between
     step solution and embedding, store in ark_mem->tempv1, store norm in dsmPtr, and
     copy solution back to ycur */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    N_VLinearSum(ONE, ytilde, -ONE, ark_mem->ycur, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
    N_VScale(ONE, ytilde, ark_mem->ycur);
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  return (ARK_SUCCESS);
}